

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O3

spv_result_t spvtools::val::anon_unknown_2::ValidateEntryPoints(ValidationState_t *_)

{
  _Rb_tree_header *p_Var1;
  uint id;
  bool bVar2;
  spv_result_t sVar3;
  iterator iVar4;
  _Base_ptr p_Var5;
  Instruction *pIVar6;
  _Base_ptr p_Var7;
  long lVar8;
  char *pcVar9;
  uint *puVar10;
  uint *puVar11;
  string local_228;
  DiagnosticStream local_208;
  
  ValidationState_t::ComputeFunctionToEntryPointMapping(_);
  ValidationState_t::ComputeRecursiveEntryPoints(_);
  puVar10 = (_->entry_points_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_start;
  puVar11 = (_->entry_points_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (puVar10 == puVar11) {
    bVar2 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityLinkage);
    if (!bVar2) {
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_BINARY,(Instruction *)0x0);
      pcVar9 = 
      "No OpEntryPoint instruction was found. This is only allowed if the Linkage capability is being used."
      ;
      lVar8 = 100;
LAB_005ebc75:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,pcVar9,lVar8);
      sVar3 = local_208.error_;
LAB_005ebc87:
      DiagnosticStream::~DiagnosticStream(&local_208);
      return sVar3;
    }
    puVar10 = (_->entry_points_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start;
    puVar11 = (_->entry_points_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  }
  if (puVar10 != puVar11) {
    p_Var1 = &(_->recursive_entry_points_)._M_t._M_impl.super__Rb_tree_header;
    do {
      local_208._0_4_ = *puVar10;
      iVar4 = std::
              _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::find(&(_->function_call_targets_)._M_h,(key_type_conflict *)&local_208);
      if (iVar4.super__Node_iterator_base<unsigned_int,_false>._M_cur != (__node_type *)0x0) {
        pIVar6 = ValidationState_t::FindDef(_,*puVar10);
        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_BINARY,pIVar6);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,"A function (",0xc)
        ;
        std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
        pcVar9 = 
        ") may not be targeted by both an OpEntryPoint instruction and an OpFunctionCall instruction."
        ;
        lVar8 = 0x5c;
        goto LAB_005ebc75;
      }
      bVar2 = spvIsVulkanEnv(_->context_->target_env);
      if ((bVar2) &&
         (p_Var5 = (_->recursive_entry_points_)._M_t._M_impl.super__Rb_tree_header._M_header.
                   _M_parent, p_Var5 != (_Base_ptr)0x0)) {
        id = *puVar10;
        p_Var7 = &p_Var1->_M_header;
        do {
          bVar2 = (uint)*(size_t *)(p_Var5 + 1) < id;
          if (!bVar2) {
            p_Var7 = p_Var5;
          }
          p_Var5 = (&p_Var5->_M_left)[bVar2];
        } while (p_Var5 != (_Base_ptr)0x0);
        if (((_Rb_tree_header *)p_Var7 != p_Var1) &&
           ((uint)((_Rb_tree_header *)p_Var7)->_M_node_count <= id)) {
          pIVar6 = ValidationState_t::FindDef(_,id);
          ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_BINARY,pIVar6);
          ValidationState_t::VkErrorID_abi_cxx11_(&local_228,_,0x121a,(char *)0x0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_208,local_228._M_dataplus._M_p,local_228._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_208,"Entry points may not have a call graph with cycles.",
                     0x33);
          sVar3 = local_208.error_;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_228._M_dataplus._M_p != &local_228.field_2) {
            operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
          }
          goto LAB_005ebc87;
        }
      }
      puVar10 = puVar10 + 1;
    } while (puVar10 != puVar11);
  }
  sVar3 = ValidateFloatControls2(_);
  if (sVar3 == SPV_SUCCESS) {
    sVar3 = ValidateDuplicateExecutionModes(_);
  }
  return sVar3;
}

Assistant:

spv_result_t ValidateEntryPoints(ValidationState_t& _) {
  _.ComputeFunctionToEntryPointMapping();
  _.ComputeRecursiveEntryPoints();

  if (_.entry_points().empty() && !_.HasCapability(spv::Capability::Linkage)) {
    return _.diag(SPV_ERROR_INVALID_BINARY, nullptr)
           << "No OpEntryPoint instruction was found. This is only allowed if "
              "the Linkage capability is being used.";
  }

  for (const auto& entry_point : _.entry_points()) {
    if (_.IsFunctionCallTarget(entry_point)) {
      return _.diag(SPV_ERROR_INVALID_BINARY, _.FindDef(entry_point))
             << "A function (" << entry_point
             << ") may not be targeted by both an OpEntryPoint instruction and "
                "an OpFunctionCall instruction.";
    }

    // For Vulkan, the static function-call graph for an entry point
    // must not contain cycles.
    if (spvIsVulkanEnv(_.context()->target_env)) {
      if (_.recursive_entry_points().find(entry_point) !=
          _.recursive_entry_points().end()) {
        return _.diag(SPV_ERROR_INVALID_BINARY, _.FindDef(entry_point))
               << _.VkErrorID(4634)
               << "Entry points may not have a call graph with cycles.";
      }
    }
  }

  if (auto error = ValidateFloatControls2(_)) {
    return error;
  }
  if (auto error = ValidateDuplicateExecutionModes(_)) {
    return error;
  }

  return SPV_SUCCESS;
}